

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void jpgd::DCT_Upsample::P_Q<5,_6>::calc(Matrix44 *P,Matrix44 *Q,jpgd_block_t *pSrc)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  Element_Type *pEVar33;
  short *in_RDX;
  Matrix44 *in_RSI;
  Matrix44 *in_RDI;
  Temp_Type X037;
  Temp_Type X036;
  Temp_Type X035;
  Temp_Type X034;
  Temp_Type X033;
  Temp_Type X032;
  Temp_Type X031;
  Temp_Type X030;
  Temp_Type X027;
  Temp_Type X026;
  Temp_Type X025;
  Temp_Type X024;
  Temp_Type X023;
  Temp_Type X022;
  Temp_Type X021;
  Temp_Type X020;
  Temp_Type X017;
  Temp_Type X016;
  Temp_Type X015;
  Temp_Type X014;
  Temp_Type X013;
  Temp_Type X012;
  Temp_Type X011;
  Temp_Type X010;
  Temp_Type X007;
  Temp_Type X006;
  Temp_Type X005;
  Temp_Type X004;
  Temp_Type X003;
  Temp_Type X002;
  Temp_Type X001;
  Temp_Type X000;
  
  sVar1 = *in_RDX;
  iVar25 = (int)in_RDX[8];
  sVar2 = in_RDX[0x10];
  iVar26 = (int)in_RDX[0x18];
  sVar3 = in_RDX[0x20];
  sVar4 = in_RDX[1];
  sVar5 = in_RDX[3];
  sVar6 = in_RDX[5];
  iVar27 = in_RDX[9] * 0x1aa + in_RDX[0xb] * 0x32a + in_RDX[0xd] * -0x168 + 0x200 >> 10;
  sVar7 = in_RDX[0x11];
  sVar8 = in_RDX[0x13];
  sVar9 = in_RDX[0x15];
  iVar28 = in_RDX[0x19] * 0x1aa + in_RDX[0x1b] * 0x32a + in_RDX[0x1d] * -0x168 + 0x200 >> 10;
  sVar10 = in_RDX[0x21];
  sVar11 = in_RDX[0x23];
  sVar12 = in_RDX[0x25];
  sVar13 = in_RDX[4];
  iVar29 = (int)in_RDX[0xc];
  sVar14 = in_RDX[0x14];
  iVar30 = (int)in_RDX[0x1c];
  sVar15 = in_RDX[0x24];
  sVar16 = in_RDX[1];
  sVar17 = in_RDX[3];
  sVar18 = in_RDX[5];
  iVar31 = in_RDX[9] * 0x17 + in_RDX[0xb] * -99 + in_RDX[0xd] * 0x1f6 + 0x200 >> 10;
  sVar19 = in_RDX[0x11];
  sVar20 = in_RDX[0x13];
  sVar21 = in_RDX[0x15];
  iVar32 = in_RDX[0x19] * 0x17 + in_RDX[0x1b] * -99 + in_RDX[0x1d] * 0x1f6 + 0x200 >> 10;
  sVar22 = in_RDX[0x21];
  sVar23 = in_RDX[0x23];
  sVar24 = in_RDX[0x25];
  pEVar33 = Matrix44::at(in_RDI,0,0);
  *pEVar33 = (int)sVar1;
  pEVar33 = Matrix44::at(in_RDI,0,1);
  *pEVar33 = iVar25 * 0x1aa + iVar26 * 0x32a + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RDI,0,2);
  *pEVar33 = (int)sVar3;
  pEVar33 = Matrix44::at(in_RDI,0,3);
  *pEVar33 = iVar25 * 0x17 + iVar26 * -99 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RDI,1,0);
  *pEVar33 = sVar4 * 0x1aa + sVar5 * 0x32a + sVar6 * -0x168 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RDI,1,1);
  *pEVar33 = iVar27 * 0x1aa + iVar28 * 0x32a + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RDI,1,2);
  *pEVar33 = sVar10 * 0x1aa + sVar11 * 0x32a + sVar12 * -0x168 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RDI,1,3);
  *pEVar33 = iVar27 * 0x17 + iVar28 * -99 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RDI,2,0);
  *pEVar33 = (int)sVar13;
  pEVar33 = Matrix44::at(in_RDI,2,1);
  *pEVar33 = iVar29 * 0x1aa + iVar30 * 0x32a + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RDI,2,2);
  *pEVar33 = (int)sVar15;
  pEVar33 = Matrix44::at(in_RDI,2,3);
  *pEVar33 = iVar29 * 0x17 + iVar30 * -99 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RDI,3,0);
  *pEVar33 = sVar16 * 0x17 + sVar17 * -99 + sVar18 * 0x1f6 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RDI,3,1);
  *pEVar33 = iVar31 * 0x1aa + iVar32 * 0x32a + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RDI,3,2);
  *pEVar33 = sVar22 * 0x17 + sVar23 * -99 + sVar24 * 0x1f6 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RDI,3,3);
  *pEVar33 = iVar31 * 0x17 + iVar32 * -99 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RSI,0,0);
  *pEVar33 = iVar25 * 0x3a0 + iVar26 * -0x145 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RSI,0,1);
  *pEVar33 = (int)sVar2;
  pEVar33 = Matrix44::at(in_RSI,0,2);
  *pEVar33 = iVar25 * -0x4b + iVar26 * 0x20e + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RSI,0,3);
  *pEVar33 = 0;
  pEVar33 = Matrix44::at(in_RSI,1,0);
  *pEVar33 = iVar27 * 0x3a0 + iVar28 * -0x145 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RSI,1,1);
  *pEVar33 = sVar7 * 0x1aa + sVar8 * 0x32a + sVar9 * -0x168 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RSI,1,2);
  *pEVar33 = iVar27 * -0x4b + iVar28 * 0x20e + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RSI,1,3);
  *pEVar33 = 0;
  pEVar33 = Matrix44::at(in_RSI,2,0);
  *pEVar33 = iVar29 * 0x3a0 + iVar30 * -0x145 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RSI,2,1);
  *pEVar33 = (int)sVar14;
  pEVar33 = Matrix44::at(in_RSI,2,2);
  *pEVar33 = iVar29 * -0x4b + iVar30 * 0x20e + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RSI,2,3);
  *pEVar33 = 0;
  pEVar33 = Matrix44::at(in_RSI,3,0);
  *pEVar33 = iVar31 * 0x3a0 + iVar32 * -0x145 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RSI,3,1);
  *pEVar33 = sVar19 * 0x17 + sVar20 * -99 + sVar21 * 0x1f6 + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RSI,3,2);
  *pEVar33 = iVar31 * -0x4b + iVar32 * 0x20e + 0x200 >> 10;
  pEVar33 = Matrix44::at(in_RSI,3,3);
  *pEVar33 = 0;
  return;
}

Assistant:

static void calc(Matrix44& P, Matrix44& Q, const jpgd_block_t* pSrc) {
    // 4x8 = 4x8 times 8x8, matrix 0 is constant
    const Temp_Type X000 = AT(0, 0);
    const Temp_Type X001 = AT(0, 1);
    const Temp_Type X002 = AT(0, 2);
    const Temp_Type X003 = AT(0, 3);
    const Temp_Type X004 = AT(0, 4);
    const Temp_Type X005 = AT(0, 5);
    const Temp_Type X006 = AT(0, 6);
    const Temp_Type X007 = AT(0, 7);
    const Temp_Type X010 = D(F(0.415735f) * AT(1, 0) + F(0.791065f) * AT(3, 0) + F(-0.352443f) * AT(5, 0) + F(0.277785f) * AT(7, 0));
    const Temp_Type X011 = D(F(0.415735f) * AT(1, 1) + F(0.791065f) * AT(3, 1) + F(-0.352443f) * AT(5, 1) + F(0.277785f) * AT(7, 1));
    const Temp_Type X012 = D(F(0.415735f) * AT(1, 2) + F(0.791065f) * AT(3, 2) + F(-0.352443f) * AT(5, 2) + F(0.277785f) * AT(7, 2));
    const Temp_Type X013 = D(F(0.415735f) * AT(1, 3) + F(0.791065f) * AT(3, 3) + F(-0.352443f) * AT(5, 3) + F(0.277785f) * AT(7, 3));
    const Temp_Type X014 = D(F(0.415735f) * AT(1, 4) + F(0.791065f) * AT(3, 4) + F(-0.352443f) * AT(5, 4) + F(0.277785f) * AT(7, 4));
    const Temp_Type X015 = D(F(0.415735f) * AT(1, 5) + F(0.791065f) * AT(3, 5) + F(-0.352443f) * AT(5, 5) + F(0.277785f) * AT(7, 5));
    const Temp_Type X016 = D(F(0.415735f) * AT(1, 6) + F(0.791065f) * AT(3, 6) + F(-0.352443f) * AT(5, 6) + F(0.277785f) * AT(7, 6));
    const Temp_Type X017 = D(F(0.415735f) * AT(1, 7) + F(0.791065f) * AT(3, 7) + F(-0.352443f) * AT(5, 7) + F(0.277785f) * AT(7, 7));
    const Temp_Type X020 = AT(4, 0);
    const Temp_Type X021 = AT(4, 1);
    const Temp_Type X022 = AT(4, 2);
    const Temp_Type X023 = AT(4, 3);
    const Temp_Type X024 = AT(4, 4);
    const Temp_Type X025 = AT(4, 5);
    const Temp_Type X026 = AT(4, 6);
    const Temp_Type X027 = AT(4, 7);
    const Temp_Type X030 = D(F(0.022887f) * AT(1, 0) + F(-0.097545f) * AT(3, 0) + F(0.490393f) * AT(5, 0) + F(0.865723f) * AT(7, 0));
    const Temp_Type X031 = D(F(0.022887f) * AT(1, 1) + F(-0.097545f) * AT(3, 1) + F(0.490393f) * AT(5, 1) + F(0.865723f) * AT(7, 1));
    const Temp_Type X032 = D(F(0.022887f) * AT(1, 2) + F(-0.097545f) * AT(3, 2) + F(0.490393f) * AT(5, 2) + F(0.865723f) * AT(7, 2));
    const Temp_Type X033 = D(F(0.022887f) * AT(1, 3) + F(-0.097545f) * AT(3, 3) + F(0.490393f) * AT(5, 3) + F(0.865723f) * AT(7, 3));
    const Temp_Type X034 = D(F(0.022887f) * AT(1, 4) + F(-0.097545f) * AT(3, 4) + F(0.490393f) * AT(5, 4) + F(0.865723f) * AT(7, 4));
    const Temp_Type X035 = D(F(0.022887f) * AT(1, 5) + F(-0.097545f) * AT(3, 5) + F(0.490393f) * AT(5, 5) + F(0.865723f) * AT(7, 5));
    const Temp_Type X036 = D(F(0.022887f) * AT(1, 6) + F(-0.097545f) * AT(3, 6) + F(0.490393f) * AT(5, 6) + F(0.865723f) * AT(7, 6));
    const Temp_Type X037 = D(F(0.022887f) * AT(1, 7) + F(-0.097545f) * AT(3, 7) + F(0.490393f) * AT(5, 7) + F(0.865723f) * AT(7, 7));

    // 4x4 = 4x8 times 8x4, matrix 1 is constant
    P.at(0, 0) = X000;
    P.at(0, 1) = D(X001 * F(0.415735f) + X003 * F(0.791065f) + X005 * F(-0.352443f) + X007 * F(0.277785f));
    P.at(0, 2) = X004;
    P.at(0, 3) = D(X001 * F(0.022887f) + X003 * F(-0.097545f) + X005 * F(0.490393f) + X007 * F(0.865723f));
    P.at(1, 0) = X010;
    P.at(1, 1) = D(X011 * F(0.415735f) + X013 * F(0.791065f) + X015 * F(-0.352443f) + X017 * F(0.277785f));
    P.at(1, 2) = X014;
    P.at(1, 3) = D(X011 * F(0.022887f) + X013 * F(-0.097545f) + X015 * F(0.490393f) + X017 * F(0.865723f));
    P.at(2, 0) = X020;
    P.at(2, 1) = D(X021 * F(0.415735f) + X023 * F(0.791065f) + X025 * F(-0.352443f) + X027 * F(0.277785f));
    P.at(2, 2) = X024;
    P.at(2, 3) = D(X021 * F(0.022887f) + X023 * F(-0.097545f) + X025 * F(0.490393f) + X027 * F(0.865723f));
    P.at(3, 0) = X030;
    P.at(3, 1) = D(X031 * F(0.415735f) + X033 * F(0.791065f) + X035 * F(-0.352443f) + X037 * F(0.277785f));
    P.at(3, 2) = X034;
    P.at(3, 3) = D(X031 * F(0.022887f) + X033 * F(-0.097545f) + X035 * F(0.490393f) + X037 * F(0.865723f));
    // 40 muls 24 adds

    // 4x4 = 4x8 times 8x4, matrix 1 is constant
    Q.at(0, 0) = D(X001 * F(0.906127f) + X003 * F(-0.318190f) + X005 * F(0.212608f) + X007 * F(-0.180240f));
    Q.at(0, 1) = X002;
    Q.at(0, 2) = D(X001 * F(-0.074658f) + X003 * F(0.513280f) + X005 * F(0.768178f) + X007 * F(-0.375330f));
    Q.at(0, 3) = X006;
    Q.at(1, 0) = D(X011 * F(0.906127f) + X013 * F(-0.318190f) + X015 * F(0.212608f) + X017 * F(-0.180240f));
    Q.at(1, 1) = X012;
    Q.at(1, 2) = D(X011 * F(-0.074658f) + X013 * F(0.513280f) + X015 * F(0.768178f) + X017 * F(-0.375330f));
    Q.at(1, 3) = X016;
    Q.at(2, 0) = D(X021 * F(0.906127f) + X023 * F(-0.318190f) + X025 * F(0.212608f) + X027 * F(-0.180240f));
    Q.at(2, 1) = X022;
    Q.at(2, 2) = D(X021 * F(-0.074658f) + X023 * F(0.513280f) + X025 * F(0.768178f) + X027 * F(-0.375330f));
    Q.at(2, 3) = X026;
    Q.at(3, 0) = D(X031 * F(0.906127f) + X033 * F(-0.318190f) + X035 * F(0.212608f) + X037 * F(-0.180240f));
    Q.at(3, 1) = X032;
    Q.at(3, 2) = D(X031 * F(-0.074658f) + X033 * F(0.513280f) + X035 * F(0.768178f) + X037 * F(-0.375330f));
    Q.at(3, 3) = X036;
    // 40 muls 24 adds
  }